

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uchar matchHuff(FILE *f,uchar number,uchar ACorDC)

{
  _Rb_tree<std::pair<unsigned_char,_unsigned_int>,_std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>,_std::_Select1st<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
  *this;
  bool bVar1;
  key_type in_RAX;
  iterator iVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  undefined3 in_register_00000011;
  int iVar5;
  ulong uVar6;
  undefined7 in_register_00000031;
  uint uVar7;
  key_type local_38;
  
  local_38 = in_RAX;
  bVar1 = getBit(f);
  uVar7 = (uint)bVar1;
  uVar6 = (ulong)(uint)((int)CONCAT71(in_register_00000031,number) * 0x30);
  this = (_Rb_tree<std::pair<unsigned_char,_unsigned_int>,_std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>,_std::_Select1st<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
          *)(&huffTable[0][0]._M_t._M_impl.field_0x0 +
            uVar6 + (uint)(CONCAT31(in_register_00000011,ACorDC) * 0x60));
  local_38.first = '\x01';
  local_38.second._0_1_ = bVar1;
  local_38.second._1_3_ = 0;
  iVar2 = std::
          _Rb_tree<std::pair<unsigned_char,_unsigned_int>,_std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>,_std::_Select1st<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
          ::find(this,&local_38);
  iVar5 = 1;
  if (iVar2._M_node ==
      (_Base_ptr)
      ((long)&huffTable[0][0]._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
      uVar6 + (uint)(CONCAT31(in_register_00000011,ACorDC) * 0x60))) {
    iVar5 = 1;
    do {
      if (0x10 < iVar5) {
        matchHuff();
        uVar7 = 0;
        iVar5 = 1;
      }
      iVar5 = iVar5 + 1;
      bVar1 = getBit(f);
      uVar7 = (uint)bVar1 + uVar7 * 2;
      local_38.first = (uchar)iVar5;
      local_38.second = uVar7;
      iVar4 = std::
              _Rb_tree<std::pair<unsigned_char,_unsigned_int>,_std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>,_std::_Select1st<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
              ::find(this,&local_38);
    } while (iVar4._M_node == iVar2._M_node);
  }
  local_38.first = (uchar)iVar5;
  local_38.second = uVar7;
  pmVar3 = std::
           map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
           ::operator[]((map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
                         *)this,&local_38);
  return *pmVar3;
}

Assistant:

unsigned char matchHuff(FILE *f, unsigned char number, unsigned char ACorDC) {
    unsigned int len = 0;
    unsigned char codeLen;
    for (int count = 1; ; count++) {
        len = len << 1;
        len += (unsigned int)getBit(f);
        if (huffTable[ACorDC][number].find(std::make_pair(count, len)) != huffTable[ACorDC][number].end()) {
            codeLen = huffTable[ACorDC][number][std::make_pair(count, len)];
            return codeLen;
        }
        if (count > 16) {fprintf(stderr, "key not found\n"); count = 1; len = 0;}
    }
}